

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QList<int> * __thiscall
QToolBarAreaLayoutInfo::gapIndex
          (QList<int> *__return_storage_ptr__,QToolBarAreaLayoutInfo *this,QPoint *pos,
          int *minDistance)

{
  QToolBarAreaLayoutLine *this_00;
  QToolBarAreaLayoutItem *this_01;
  Orientation OVar1;
  QToolBarAreaLayoutLine *pQVar2;
  ulong uVar3;
  QSize QVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  QSize QVar9;
  long lVar10;
  Representation RVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long in_FS_OFFSET;
  bool bVar15;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = QRect::contains((QPoint *)&this->rect,SUB81(pos,0));
  if (cVar5 == '\0') {
    iVar7 = distance(this,pos);
    if ((-1 < iVar7) && (iVar7 < *minDistance)) {
      *minDistance = iVar7;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
      local_3c = (int)(this->lines).d.size;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 &local_3c);
      QList<int>::end(__return_storage_ptr__);
      local_3c = 0;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 &local_3c);
      QList<int>::end(__return_storage_ptr__);
      goto LAB_004b8485;
    }
  }
  else {
    iVar7 = (pos->yp).m_i - (this->rect).y1.m_i;
    if (this->o == Horizontal) {
      iVar7 = (pos->xp).m_i - (this->rect).x1.m_i;
    }
    bVar15 = (this->lines).d.size != 0;
    if (bVar15) {
      lVar14 = 0;
      uVar12 = 0;
      do {
        pQVar2 = (this->lines).d.ptr;
        this_00 = (QToolBarAreaLayoutLine *)((long)&(pQVar2->rect).x1.m_i + lVar14);
        bVar6 = QToolBarAreaLayoutLine::skip(this_00);
        if ((!bVar6) && (cVar5 = QRect::contains((QPoint *)this_00,SUB81(pos,0)), cVar5 != '\0')) {
          if (*(long *)((long)&(pQVar2->toolBarItems).d.size + lVar14) == 0) {
            iVar13 = 0;
            goto LAB_004b8412;
          }
          lVar10 = 0;
          iVar13 = 0;
          goto LAB_004b8360;
        }
        uVar12 = uVar12 + 1;
        lVar14 = lVar14 + 0x30;
        uVar3 = (this->lines).d.size;
        bVar15 = uVar12 < uVar3;
      } while (uVar12 < uVar3);
    }
  }
  goto LAB_004b8472;
  while( true ) {
    iVar13 = iVar13 + 1;
    lVar10 = (long)iVar13;
    if (*(long *)((long)&(pQVar2->toolBarItems).d.size + lVar14) <= lVar10) break;
LAB_004b8360:
    this_01 = (QToolBarAreaLayoutItem *)
              (*(long *)((long)&(pQVar2->toolBarItems).d.ptr + lVar14) + lVar10 * 0x18);
    if (this_01->gap == false) {
      if (this_01->widgetItem == (QLayoutItem *)0x0) goto LAB_004b83d3;
      iVar8 = (*this_01->widgetItem->_vptr_QLayoutItem[8])();
      if ((char)iVar8 == '\0') goto LAB_004b8399;
      bVar6 = true;
    }
    else {
LAB_004b8399:
      OVar1 = this->o;
      QVar9 = QToolBarAreaLayoutItem::sizeHint(this_01);
      QVar4 = (QSize)((ulong)QVar9 >> 0x20);
      if (OVar1 == Horizontal) {
        QVar4 = QVar9;
      }
      RVar11.m_i = QVar4.wd.m_i.m_i;
      if (this_01->size < QVar4.wd.m_i.m_i) {
        RVar11.m_i = this_01->size;
      }
      if (RVar11.m_i + this_01->pos < iVar7) {
LAB_004b83d3:
        bVar6 = true;
      }
      else {
        iVar13 = iVar13 + (uint)(RVar11.m_i / 2 + this_01->pos < iVar7);
        bVar6 = false;
      }
    }
    if (!bVar6) break;
  }
LAB_004b8412:
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_3c = (int)uVar12;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,&local_3c)
  ;
  QList<int>::end(__return_storage_ptr__);
  local_3c = iVar13;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,&local_3c)
  ;
  QList<int>::end(__return_storage_ptr__);
  *minDistance = 0;
  if (bVar15) goto LAB_004b8485;
LAB_004b8472:
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_004b8485:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QToolBarAreaLayoutInfo::gapIndex(const QPoint &pos, int *minDistance) const
{
    if (rect.contains(pos)) {
        // <pos> is in QToolBarAreaLayout coordinates.
        // <item.pos> is in local dockarea coordinates (see ~20 lines below)
        // Since we're comparing p with item.pos, we put them in the same coordinate system.
        const int p = pick(o, pos - rect.topLeft());

        for (int j = 0; j < lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = lines.at(j);
            if (line.skip())
                continue;
            if (!line.rect.contains(pos))
                continue;

            int k = 0;
            for (; k < line.toolBarItems.size(); ++k) {
                const QToolBarAreaLayoutItem &item = line.toolBarItems.at(k);
                if (item.skip())
                    continue;

                int size = qMin(item.size, pick(o, item.sizeHint()));

                if (p > item.pos + size)
                    continue;
                if (p > item.pos + size/2)
                    ++k;
                break;
            }

            QList<int> result;
            result << j << k;
            *minDistance = 0; //we found a perfect match
            return result;
        }
    } else {
        const int dist = distance(pos);
        //it will only return a path if the minDistance is higher than the current distance
        if (dist >= 0 && *minDistance > dist) {
            *minDistance = dist;

            QList<int> result;
            result << lines.size() << 0;
            return result;
        }
    }

    return QList<int>();
}